

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixTruncate(unqlite_file *id,sxi64 nByte)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = ftruncate(*(int *)&id[2].pMethods,nByte);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    *(int *)((long)&id[3].pMethods + 4) = *piVar2;
    iVar1 = -2;
  }
  return iVar1;
}

Assistant:

static int unixTruncate(unqlite_file *id, sxi64 nByte){
  unixFile *pFile = (unixFile *)id;
  int rc;

  rc = ftruncate(pFile->h, (off_t)nByte);
  if( rc ){
    pFile->lastErrno = errno;
    return UNQLITE_IOERR;
  }else{
    return UNQLITE_OK;
  }
}